

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

char __thiscall
booster::locale::impl_std::utf8_moneypunct<false>::do_thousands_sep(utf8_moneypunct<false> *this)

{
  uchar bs;
  byte local_1;
  
  local_1 = std::__cxx11::moneypunct<char,false>::do_thousands_sep();
  if (0x7f < local_1) {
    if (local_1 == 0xa0) {
      local_1 = 0x20;
    }
    else {
      local_1 = 0;
    }
  }
  return local_1;
}

Assistant:

virtual char do_thousands_sep() const
    {
        unsigned char bs = base_type::do_thousands_sep();
        if(bs > 127)
            if(bs == 0xA0)
                return ' ';
            else
                return 0;
        else
            return bs;
    }